

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmLocalGenerator *root,cmLocalGenerator *gen)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  allocator local_51;
  string local_50;
  
  if (gen == root || gen == (cmLocalGenerator *)0x0) {
    bVar2 = false;
  }
  else {
    this_00 = gen->Makefile;
    std::__cxx11::string::string((string *)&local_50,"EXCLUDE_FROM_ALL",&local_51);
    bVar1 = cmMakefile::GetPropertyAsBool(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = IsExcluded(this,root,gen->Parent);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmLocalGenerator* gen) const
{
  if(!gen || gen == root)
    {
    // No directory excludes itself.
    return false;
    }

  if(gen->GetMakefile()->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This directory is excluded from its parent.
    return true;
    }

  // This directory is included in its parent.  Check whether the
  // parent is excluded.
  return this->IsExcluded(root, gen->GetParent());
}